

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *s,QFont *font)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  uint uVar4;
  QFontPrivate *pQVar5;
  ulong uVar6;
  QFontDef *this;
  ulong uVar7;
  byte bVar8;
  long in_FS_OFFSET;
  qint32 pixelSize;
  double pointSize;
  quint16 styleStrategy;
  quint8 bits;
  quint8 styleHint;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  ushort local_34;
  byte local_32;
  signed local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar5);
  QExplicitlySharedDataPointer<QFontPrivate>::reset(&font->d,pQVar5);
  font->resolve_mask = 0xfffff;
  local_31 = 0xaa;
  local_32 = 0xaa;
  local_34 = 1;
  if (*(int *)(s + 0x18) == 1) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    operator>>(s,(QByteArray *)&local_58);
    QString::fromLatin1<void>((QString *)&QStack_88,(QByteArray *)&local_58);
    QList<QString>::QList<QString,void>((QList<QString> *)&local_70,(QString *)&QStack_88);
    QArrayDataPointer<QString>::operator=
              ((QArrayDataPointer<QString> *)&((font->d).d.ptr)->request,&local_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    operator>>(s,(QString *)&local_58);
    QList<QString>::QList<QString,void>((QList<QString> *)&local_70,(QString *)&local_58);
    QArrayDataPointer<QString>::operator=
              ((QArrayDataPointer<QString> *)&((font->d).d.ptr)->request,&local_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
    if (0xf < *(int *)(s + 0x18)) {
      operator>>(s,(QString *)&(((font->d).d.ptr)->request).styleName);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  if (*(int *)(s + 0x18) < 7) {
    local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0xaaaa);
    local_70.d._0_4_ = CONCAT22(local_70.d._2_2_,0xffff);
    QDataStream::operator>>(s,(short *)&local_58);
    if (*(int *)(s + 0x18) < 4) {
      dVar3 = -1.0;
    }
    else {
      QDataStream::operator>>(s,(short *)&local_70);
      dVar3 = (double)(int)(short)local_70.d;
    }
    pQVar5 = (font->d).d.ptr;
    (pQVar5->request).pointSize = (double)(int)(short)(ushort)local_58.d / 10.0;
  }
  else {
    local_58.d = (Data *)0xffffffffffffffff;
    local_70.d._0_4_ = 0xaaaaaaaa;
    QDataStream::operator>>(s,(double *)&local_58);
    QDataStream::operator>>(s,(int *)&local_70);
    pQVar5 = (font->d).d.ptr;
    (pQVar5->request).pointSize = (qreal)local_58.d;
    dVar3 = (double)(int)(uint)local_70.d;
  }
  (pQVar5->request).pixelSize = dVar3;
  QDataStream::operator>>(s,&local_31);
  if (4 < (int)*(uint *)(s + 0x18)) {
    if (*(uint *)(s + 0x18) < 0x10) {
      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,0xaa);
      QDataStream::operator>>(s,(signed *)&local_58);
      local_34 = (ushort)(byte)local_58.d;
    }
    else {
      QDataStream::operator>>(s,(short *)&local_34);
    }
    if (0x13 < *(int *)(s + 0x18)) {
      local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0xaaaa);
      QDataStream::operator>>(s,(short *)&local_58);
      uVar4 = (uint)(ushort)local_58.d;
      goto LAB_00419786;
    }
  }
  local_58.d = (Data *)CONCAT71(local_58.d._1_7_,0xaa);
  local_70.d._0_4_ = CONCAT31(local_70.d._1_3_,0xaa);
  QDataStream::operator>>(s,(signed *)&local_58);
  QDataStream::operator>>(s,(signed *)&local_70);
  uVar4 = qt_legacyToOpenTypeWeight((uint)local_70.d & 0xff);
LAB_00419786:
  pQVar5 = (font->d).d.ptr;
  *(ulong *)&(pQVar5->request).field_0x60 =
       *(ulong *)&(pQVar5->request).field_0x60 & 0xfffc00ffffffffff | (ulong)(uVar4 & 0x3ff) << 0x28
  ;
  QDataStream::operator>>(s,&local_32);
  (((font->d).d.ptr)->request).field_0x64 = local_31;
  *(ushort *)&(((font->d).d.ptr)->request).field_0x60 = local_34;
  iVar2 = *(int *)(s + 0x18);
  pQVar5 = (font->d).d.ptr;
  uVar6 = *(ulong *)&(pQVar5->request).field_0x60 & 0xfffbffffcfffffff;
  bVar1 = pQVar5->field_0x7c;
  bVar8 = local_32 & 4 | local_32 >> 1 & 1 | local_32 >> 5 & 2;
  pQVar5->field_0x7c = bVar8 | bVar1 & 0xf8;
  uVar7 = (ulong)(local_32 >> 3 & 1) << 0x32;
  *(ulong *)&(pQVar5->request).field_0x60 = uVar7 | uVar6 | (local_32 & 1) << 0x1c;
  if (6 < iVar2) {
    pQVar5->field_0x7c = bVar8 | bVar1 & 0xf0 | local_32 >> 1 & 8;
  }
  if ((char)local_32 < '\0') {
    *(ulong *)&(pQVar5->request).field_0x60 = uVar7 | uVar6 | 0x20000000;
  }
  if (8 < *(int *)(s + 0x18)) {
    local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0xaaaa);
    QDataStream::operator>>(s,(short *)&local_58);
    pQVar5 = (font->d).d.ptr;
    *(ulong *)&(pQVar5->request).field_0x60 =
         *(ulong *)&(pQVar5->request).field_0x60 & 0xfffffffff000ffff |
         (ulong)(((ushort)local_58.d & 0xfff) << 0x10);
    if (9 < *(int *)(s + 0x18)) {
      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,0xaa);
      QDataStream::operator>>(s,(signed *)&local_58);
      pQVar5 = (font->d).d.ptr;
      *(ulong *)&(pQVar5->request).field_0x60 =
           *(ulong *)&(pQVar5->request).field_0x60 & 0xfff7ffffffffffff |
           (ulong)((byte)local_58.d & 1) << 0x33;
      pQVar5->field_0x7c = pQVar5->field_0x7c & 0x7f | ((byte)local_58.d & 2) << 6;
      if (10 < *(int *)(s + 0x18)) {
        local_58.d = (Data *)CONCAT44(local_58.d._4_4_,0xaaaaaaaa);
        QDataStream::operator>>(s,(int *)&local_58);
        (((font->d).d.ptr)->letterSpacing).val = (int)local_58.d;
        QDataStream::operator>>(s,(int *)&local_58);
        (((font->d).d.ptr)->wordSpacing).val = (int)local_58.d;
        if (0xf < *(int *)(s + 0x18)) {
          local_58.d = (Data *)CONCAT71(local_58.d._1_7_,0xaa);
          QDataStream::operator>>(s,(signed *)&local_58);
          pQVar5 = (font->d).d.ptr;
          *(ulong *)&(pQVar5->request).field_0x60 =
               *(ulong *)&(pQVar5->request).field_0x60 & 0xffffffff3fffffff |
               (ulong)((uint)(byte)local_58.d << 0x1e);
          if (0x10 < *(int *)(s + 0x18)) {
            local_58.d = (Data *)CONCAT71(local_58.d._1_7_,0xaa);
            QDataStream::operator>>(s,(signed *)&local_58);
            pQVar5 = (font->d).d.ptr;
            pQVar5->field_0x7c = pQVar5->field_0x7c & 0x8f | ((byte)local_58.d & 7) << 4;
            if (0x12 < *(int *)(s + 0x18)) {
              local_58.d = (Data *)0x0;
              local_58.ptr = (QString *)0x0;
              local_58.size = 0;
              QtPrivate::readArrayBasedContainer<QList<QString>>(s,(QList<QString> *)&local_58);
              this = &((font->d).d.ptr)->request;
              if (*(int *)(s + 0x18) < 0x14) {
                QList<QString>::append(&this->families,(QList<QString> *)&local_58);
              }
              else {
                QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)this,&local_58);
              }
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
              if (0x14 < *(int *)(s + 0x18)) {
                QHash<QFont::Tag,_unsigned_int>::clear(&((font->d).d.ptr)->features);
                QtPrivate::readAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
                          (s,&((font->d).d.ptr)->features);
                if (0x15 < *(int *)(s + 0x18)) {
                  QMap<QFont::Tag,_float>::clear(&(((font->d).d.ptr)->request).variableAxisValues);
                  QtPrivate::readAssociativeContainer<QMap<QFont::Tag,float>>
                            (s,&(((font->d).d.ptr)->request).variableAxisValues);
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QFont &font)
{
    font.d = new QFontPrivate;
    font.resolve_mask = QFont::AllPropertiesResolved;

    quint8 styleHint, bits;
    quint16 styleStrategy = QFont::PreferDefault;

    if (s.version() == 1) {
        QByteArray fam;
        s >> fam;
        font.d->request.families = QStringList(QString::fromLatin1(fam));
    } else {
        QString fam;
        s >> fam;
        font.d->request.families = QStringList(fam);
        if (s.version() >= QDataStream::Qt_5_4)
            s >> font.d->request.styleName;
    }

    if (s.version() >= QDataStream::Qt_4_0) {
        // 4.0
        double pointSize;
        qint32 pixelSize;
        s >> pointSize;
        s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize);
        font.d->request.pixelSize = pixelSize;
    } else {
        qint16 pointSize, pixelSize = -1;
        s >> pointSize;
        if (s.version() >= 4)
            s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize / 10.);
        font.d->request.pixelSize = pixelSize;
    }
    s >> styleHint;
    if (s.version() >= QDataStream::Qt_3_1) {
        if (s.version() >= QDataStream::Qt_5_4) {
            s >> styleStrategy;
        } else {
            quint8 tempStyleStrategy;
            s >> tempStyleStrategy;
            styleStrategy = tempStyleStrategy;
        }
    }

    if (s.version() < QDataStream::Qt_6_0) {
        quint8 charSet;
        quint8 weight;
        s >> charSet;
        s >> weight;
        font.d->request.weight = qt_legacyToOpenTypeWeight(weight);
    } else {
        quint16 weight;
        s >> weight;
        font.d->request.weight = weight;
    }

    s >> bits;

    font.d->request.styleHint = styleHint;
    font.d->request.styleStrategy = styleStrategy;

    set_font_bits(s.version(), bits, font.d.data());

    if (s.version() >= QDataStream::Qt_4_3) {
        quint16 stretch;
        s >> stretch;
        font.d->request.stretch = stretch;
    }

    if (s.version() >= QDataStream::Qt_4_4) {
        quint8 extendedBits;
        s >> extendedBits;
        set_extended_font_bits(extendedBits, font.d.data());
    }
    if (s.version() >= QDataStream::Qt_4_5) {
        int value;
        s >> value;
        font.d->letterSpacing.setValue(value);
        s >> value;
        font.d->wordSpacing.setValue(value);
    }
    if (s.version() >= QDataStream::Qt_5_4) {
        quint8 value;
        s >> value;
        font.d->request.hintingPreference = QFont::HintingPreference(value);
    }
    if (s.version() >= QDataStream::Qt_5_6) {
        quint8 value;
        s >> value;
        font.d->capital = QFont::Capitalization(value);
    }
    if (s.version() >= QDataStream::Qt_5_13) {
        QStringList value;
        s >> value;
        if (s.version() < QDataStream::Qt_6_0)
            font.d->request.families.append(value);
        else
            font.d->request.families = value;
    }
    if (s.version() >= QDataStream::Qt_6_6) {
        font.d->features.clear();
        s >> font.d->features;
    }
    if (s.version() >= QDataStream::Qt_6_7) {
        font.d->request.variableAxisValues.clear();
        s >> font.d->request.variableAxisValues;
    }

    return s;
}